

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

RuntimeError * __thiscall
jsonnet::internal::anon_unknown_0::Stack::makeError
          (RuntimeError *__return_storage_ptr__,Stack *this,LocationRange *loc,string *msg)

{
  _Base_ptr p_Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  RuntimeError *extraout_RAX;
  ulong *puVar9;
  size_type *psVar10;
  pointer pFVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  char *__end;
  _Base_ptr p_Var14;
  ulong uVar15;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> stack_trace;
  string name;
  string local_158;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  Stack *local_118;
  _Base_ptr local_110;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_108;
  TraceFrame local_e8;
  RuntimeError *local_88;
  string *local_80;
  pointer local_78;
  ulong local_70;
  string local_68;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_48;
  
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_118 = this;
  local_88 = __return_storage_ptr__;
  local_80 = msg;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  TraceFrame::TraceFrame(&local_e8,loc,&local_158);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  emplace_back<jsonnet::internal::TraceFrame>(&local_108,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
    operator_delete(local_e8.name._M_dataplus._M_p,local_e8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.location.file._M_dataplus._M_p != &local_e8.location.file.field_2) {
    operator_delete(local_e8.location.file._M_dataplus._M_p,
                    CONCAT71(local_e8.location.file.field_2._M_allocated_capacity._1_7_,
                             local_e8.location.file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  uVar3 = (int)((ulong)((long)(local_118->stack).
                              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_118->stack).
                             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7 - 1;
  if (-1 < (int)uVar3) {
    uVar15 = (ulong)uVar3;
    do {
      pFVar11 = (local_118->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar11[uVar15].kind == FRAME_CALL) {
        pFVar11 = pFVar11 + uVar15;
        p_Var14 = (_Base_ptr)pFVar11->context;
        local_110 = p_Var14;
        if (p_Var14 != (_Base_ptr)0x0) {
          local_e8.location.file._M_string_length = 0;
          local_e8.location.file.field_2._M_local_buf[0] = '\0';
          local_e8.location.file._M_dataplus._M_p = (pointer)&local_e8.location.file.field_2;
          local_78 = pFVar11;
          local_70 = uVar15;
          do {
            if ((int)uVar15 < 1) break;
            uVar15 = uVar15 - 1;
            pFVar11 = (local_118->stack).
                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (p_Var5 = *(_Base_ptr *)((long)&pFVar11[uVar15].bindings._M_t._M_impl + 0x18);
                p_Var5 != (_Rb_tree_node_base *)((long)&pFVar11[uVar15].bindings._M_t._M_impl + 8U);
                p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
              p_Var1 = p_Var5[1]._M_parent;
              if (((*(char *)((long)&p_Var1->_M_parent + 2) == '\x01') &&
                  (((ulong)p_Var1->_M_left & 0x10) != 0)) && (p_Var1->_M_right == p_Var14)) {
                encode_utf8(&local_158,(internal *)**(undefined8 **)(p_Var5 + 1),
                            (UString *)(*(undefined8 **)(p_Var5 + 1))[1]);
                std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_158);
                p_Var14 = local_110;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                  p_Var14 = local_110;
                }
              }
            }
          } while (pFVar11[uVar15].kind != FRAME_CALL);
          iVar4 = std::__cxx11::string::compare((char *)&local_e8);
          if (iVar4 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_e8,0,(char *)local_e8.location.file._M_string_length,0x1f7783);
          }
          lVar6 = __dynamic_cast(p_Var14,&(anonymous_namespace)::HeapEntity::typeinfo,
                                 &(anonymous_namespace)::HeapObject::typeinfo,0);
          if (lVar6 == 0) {
            lVar6 = __dynamic_cast(p_Var14,&(anonymous_namespace)::HeapEntity::typeinfo,
                                   &(anonymous_namespace)::HeapThunk::typeinfo,0);
            if (lVar6 == 0) {
              if (p_Var14[3]._M_parent == (_Base_ptr)0x0) {
                std::operator+(&local_158,"builtin function <",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p_Var14[3]._M_left);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
              }
              else {
                std::operator+(&local_158,"function <",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_e8);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
              }
              goto LAB_00176590;
            }
            puVar8 = *(undefined8 **)(lVar6 + 0x20);
            if (puVar8 != (undefined8 *)0x0) {
              encode_utf8(&local_68,(internal *)*puVar8,(UString *)puVar8[1]);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_68,0,(char *)0x0,0x1f7796);
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_158.field_2._M_allocated_capacity = *psVar10;
                local_158.field_2._8_8_ = plVar7[3];
              }
              else {
                local_158.field_2._M_allocated_capacity = *psVar10;
                local_158._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_158._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
              puVar9 = puVar8 + 2;
              if ((ulong *)*puVar8 == puVar9) {
                local_128 = *puVar9;
                lStack_120 = puVar8[3];
                local_138 = &local_128;
              }
              else {
                local_128 = *puVar9;
                local_138 = (ulong *)*puVar8;
              }
              local_130 = puVar8[1];
              *puVar8 = puVar9;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              uVar12 = local_68.field_2._M_allocated_capacity;
              _Var13._M_p = local_68._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00176684;
              goto LAB_0017667c;
            }
            local_130 = 0;
            local_128 = local_128 & 0xffffffffffffff00;
            local_138 = &local_128;
          }
          else {
            std::operator+(&local_158,"object <",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_158);
LAB_00176590:
            puVar9 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar9) {
              local_128 = *puVar9;
              lStack_120 = plVar7[3];
              local_138 = &local_128;
            }
            else {
              local_128 = *puVar9;
              local_138 = (ulong *)*plVar7;
            }
            local_130 = plVar7[1];
            *plVar7 = (long)puVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            uVar12 = local_158.field_2._M_allocated_capacity;
            _Var13._M_p = local_158._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0017667c:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
LAB_00176684:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.location.file._M_dataplus._M_p != &local_e8.location.file.field_2) {
            operator_delete(local_e8.location.file._M_dataplus._M_p,
                            CONCAT71(local_e8.location.file.field_2._M_allocated_capacity._1_7_,
                                     local_e8.location.file.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::operator=
                    ((string *)
                     &local_108.
                      super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].name,(string *)&local_138);
          pFVar11 = local_78;
          uVar15 = local_70;
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
            pFVar11 = local_78;
            uVar15 = local_70;
          }
        }
        if (((pFVar11->location).begin.line != 0) ||
           ((pFVar11->location).file._M_string_length != 0)) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"","");
          TraceFrame::TraceFrame(&local_e8,&pFVar11->location,&local_158);
          std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
          ::emplace_back<jsonnet::internal::TraceFrame>(&local_108,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
            operator_delete(local_e8.name._M_dataplus._M_p,
                            local_e8.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.location.file._M_dataplus._M_p != &local_e8.location.file.field_2) {
            operator_delete(local_e8.location.file._M_dataplus._M_p,
                            CONCAT71(local_e8.location.file.field_2._M_allocated_capacity._1_7_,
                                     local_e8.location.file.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
        }
      }
      bVar2 = 0 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar2);
  }
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            (&local_48,&local_108);
  RuntimeError::RuntimeError(local_88,&local_48,local_80);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(&local_48);
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(&local_108);
  return extraout_RAX;
}

Assistant:

RuntimeError makeError(const LocationRange &loc, const std::string &msg)
    {
        std::vector<TraceFrame> stack_trace;
        stack_trace.push_back(TraceFrame(loc));
        for (int i = stack.size() - 1; i >= 0; --i) {
            const auto &f = stack[i];
            if (f.isCall()) {
                if (f.context != nullptr) {
                    // Give the last line a name.
                    stack_trace[stack_trace.size() - 1].name = getName(i, f.context);
                }
                if (f.location.isSet() || f.location.file.length() > 0)
                    stack_trace.push_back(TraceFrame(f.location));
            }
        }
        return RuntimeError(stack_trace, msg);
    }